

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O1

void Net_SkipCommand(int type,BYTE **stream)

{
  byte bVar1;
  BYTE *pBVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  ulong uVar6;
  
  switch(type) {
  case 4:
  case 5:
  case 6:
  case 8:
  case 0xe:
  case 0x1a:
  case 0x25:
  case 0x26:
  case 0x2b:
  case 0x2c:
  case 0x32:
  case 0x3a:
  case 0x44:
    sVar3 = strlen((char *)*stream);
LAB_00493181:
    uVar6 = sVar3 + 1;
    break;
  default:
    goto switchD_00493174_caseD_7;
  case 9:
  case 0x21:
    bVar1 = **stream;
    uVar6 = (ulong)(bVar1 & 0x3f);
    sVar3 = uVar6 + 1;
    if (type != 9) goto LAB_00493181;
    bVar1 = bVar1 >> 6;
    if (bVar1 - 1 < 2) {
      uVar6 = uVar6 + 5;
    }
    else {
      if (bVar1 != 3) goto LAB_00493181;
      sVar4 = strlen((char *)(*stream + sVar3));
      uVar6 = sVar3 + sVar4 + 1;
    }
    break;
  case 10:
  case 0xd:
  case 0x1b:
  case 0x1c:
  case 0x30:
  case 0x31:
    uVar6 = 1;
    break;
  case 0xb:
  case 0x2f:
    sVar3 = strlen((char *)*stream);
    uVar6 = sVar3 + 3;
    break;
  case 0xc:
  case 0x1d:
    sVar3 = strlen((char *)(*stream + 1));
    uVar6 = sVar3 + 2;
    break;
  case 0x10:
    sVar3 = strlen((char *)(*stream + 1));
    uVar6 = sVar3 + 6;
    break;
  case 0x13:
  case 0x22:
    uVar6 = 4;
    break;
  case 0x15:
    pBVar2 = *stream;
    sVar3 = strlen((char *)pBVar2);
    sVar4 = strlen((char *)(pBVar2 + sVar3 + 1));
    uVar6 = sVar4 + sVar3 + 2;
    break;
  case 0x20:
  case 0x28:
  case 0x3e:
    uVar6 = (ulong)(*stream)[2] * 4 + 3;
    break;
  case 0x23:
    uVar6 = 6;
    break;
  case 0x34:
  case 0x35:
  case 0x36:
    sVar3 = strlen((char *)*stream);
    uVar6 = sVar3 + 0x1a;
    break;
  case 0x37:
  case 0x38:
    uVar6 = (ulong)((*stream)[1] >> 7) | 2;
    break;
  case 0x39:
  case 0x43:
    bVar1 = (*stream)[(ulong)(type == 0x43) + 1];
    uVar6 = (ulong)(type == 0x43) | 2;
    if (bVar1 != 0) {
      iVar5 = bVar1 + 1;
      do {
        uVar6 = uVar6 + ((*stream)[uVar6] >> 7) + 1;
        iVar5 = iVar5 + -1;
      } while (1 < iVar5);
    }
    break;
  case 0x3b:
    uVar6 = 3;
    break;
  case 0x3f:
    uVar6 = 2;
    break;
  case 0x41:
    pBVar2 = *stream;
    sVar3 = strlen((char *)pBVar2);
    uVar6 = sVar3 + (ulong)(pBVar2[sVar3 + 1] & 0x7f) * 4 + 2;
  }
  *stream = *stream + uVar6;
switchD_00493174_caseD_7:
  return;
}

Assistant:

void Net_SkipCommand (int type, BYTE **stream)
{
	BYTE t;
	size_t skip;

	switch (type)
	{
		case DEM_SAY:
			skip = strlen ((char *)(*stream + 1)) + 2;
			break;

		case DEM_ADDBOT:
			skip = strlen ((char *)(*stream + 1)) + 6;
			break;

		case DEM_GIVECHEAT:
		case DEM_TAKECHEAT:
			skip = strlen ((char *)(*stream)) + 3;
			break;

		case DEM_SUMMON2:
		case DEM_SUMMONFRIEND2:
		case DEM_SUMMONFOE2:
			skip = strlen ((char *)(*stream)) + 26;
			break;
		case DEM_CHANGEMAP2:
			skip = strlen((char *)(*stream + 1)) + 2;
			break;
		case DEM_MUSICCHANGE:
		case DEM_PRINT:
		case DEM_CENTERPRINT:
		case DEM_UINFCHANGED:
		case DEM_CHANGEMAP:
		case DEM_SUMMON:
		case DEM_SUMMONFRIEND:
		case DEM_SUMMONFOE:
		case DEM_SUMMONMBF:
		case DEM_REMOVE:
		case DEM_SPRAY:
		case DEM_MORPHEX:
		case DEM_KILLCLASSCHEAT:
			skip = strlen ((char *)(*stream)) + 1;
			break;

		case DEM_WARPCHEAT:
			skip = 6;
			break;

		case DEM_INVUSE:
		case DEM_INVDROP:
			skip = 4;
			break;

		case DEM_GENERICCHEAT:
		case DEM_DROPPLAYER:
		case DEM_FOV:
		case DEM_MYFOV:
		case DEM_ADDCONTROLLER:
		case DEM_DELCONTROLLER:
			skip = 1;
			break;

		case DEM_SAVEGAME:
			skip = strlen ((char *)(*stream)) + 1;
			skip += strlen ((char *)(*stream) + skip) + 1;
			break;

		case DEM_SINFCHANGEDXOR:
		case DEM_SINFCHANGED:
			t = **stream;
			skip = 1 + (t & 63);
			if (type == DEM_SINFCHANGED)
			{
				switch (t >> 6)
				{
				case CVAR_Bool:
					skip += 1;
					break;
				case CVAR_Int: case CVAR_Float:
					skip += 4;
					break;
				case CVAR_String:
					skip += strlen ((char *)(*stream + skip)) + 1;
					break;
				}
			}
			else
			{
				skip += 1;
			}
			break;

		case DEM_RUNSCRIPT:
		case DEM_RUNSCRIPT2:
			skip = 3 + *(*stream + 2) * 4;
			break;

		case DEM_RUNNAMEDSCRIPT:
			skip = strlen((char *)(*stream)) + 2;
			skip += ((*(*stream + skip - 1)) & 127) * 4;
			break;

		case DEM_RUNSPECIAL:
			skip = 3 + *(*stream + 2) * 4;
			break;

		case DEM_CONVREPLY:
			skip = 3;
			break;

		case DEM_SETSLOT:
		case DEM_SETSLOTPNUM:
			{
				skip = 2 + (type == DEM_SETSLOTPNUM);
				for(int numweapons = (*stream)[skip-1]; numweapons > 0; numweapons--)
				{
					skip += 1 + ((*stream)[skip] >> 7);
				}
			}
			break;

		case DEM_ADDSLOT:
		case DEM_ADDSLOTDEFAULT:
			skip = 2 + ((*stream)[1] >> 7);
			break;

		case DEM_SETPITCHLIMIT:
			skip = 2;
			break;

		default:
			return;
	}

	*stream += skip;
}